

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameBoard.cpp
# Opt level: O3

void __thiscall GameBoard::printGameStatistics(GameBoard *this)

{
  _List_node_base *p_Var1;
  long *plVar2;
  int iVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Playing:",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  p_Var1 = (this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
           super__List_node_base._M_next;
  (this->it)._M_node = p_Var1;
  if (p_Var1 != (_List_node_base *)&this->players) {
    iVar3 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      Player::PrintPlayerStats((Player *)((this->it)._M_node + 1));
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      iVar3 = iVar3 + 1;
      p_Var1 = ((this->it)._M_node)->_M_next;
      (this->it)._M_node = p_Var1;
    } while (p_Var1 != (_List_node_base *)&this->players);
  }
  return;
}

Assistant:

void GameBoard::printGameStatistics()                                   //prints all players' stats
{
    cout << "Playing:" << endl << endl;

    int count=1;

    for (it=players.begin(); it!=players.end(); it++)
    {
        cout << "Player " << count << endl;
        it->PrintPlayerStats();
        cout << endl;

        count++;
    }
}